

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_cform.cxx
# Opt level: O3

void __thiscall
xray_re::xr_level_cform::xr_level_cform(xr_level_cform *this,uint32_t xrlc_version,xr_reader *r)

{
  uint32_t id;
  xr_reader *local_20;
  
  xr_cform::xr_cform(&this->super_xr_cform);
  (this->super_xr_cform)._vptr_xr_cform = (_func_int **)&PTR__xr_cform_00249a08;
  id = 6;
  if ((xrlc_version == 5) || (id = 5, (xrlc_version & 0xfffffffe) == 8)) {
    local_20 = xr_reader::open_chunk(r,id);
    if (local_20 != (xr_reader *)0x0) {
      xr_cform::load(&this->super_xr_cform,local_20);
      xr_reader::close_chunk(r,&local_20);
      return;
    }
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_cform.cxx"
                ,0xe,"xray_re::xr_level_cform::xr_level_cform(uint32_t, xr_reader &)");
}

Assistant:

xr_level_cform::xr_level_cform(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version == XRLC_VERSION_5)
		s = r.open_chunk(FSL5_CFORM);
	else if (xrlc_version == XRLC_VERSION_8 || xrlc_version == XRLC_VERSION_9)
		s = r.open_chunk(FSL8_CFORM);
	xr_assert(s);
	xr_cform::load(*s);
	r.close_chunk(s);
}